

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_compareScalingFactorWithNullptrAsBothParameters_Test::TestBody
          (Units_compareScalingFactorWithNullptrAsBothParameters_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  long *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  double local_18;
  double local_10;
  
  local_18 = 0.0;
  local_48 = (long *)0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = 0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_10 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_48,(shared_ptr *)&local_38,true);
  testing::internal::CmpHelperEQ<double,double>
            (local_28,"0.0","libcellml::Units::scalingFactor(nullptr, nullptr)",&local_18,&local_10)
  ;
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x447,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if (local_48 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_48 != (long *)0x0)) {
        (**(code **)(*local_48 + 8))();
      }
      local_48 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_18 = 0.0;
  local_48 = (long *)0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = 0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_10 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_48,(shared_ptr *)&local_38,false);
  testing::internal::CmpHelperEQ<double,double>
            (local_28,"0.0","libcellml::Units::scalingFactor(nullptr, nullptr, false)",&local_18,
             &local_10);
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x448,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if (local_48 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_48 != (long *)0x0)) {
        (**(code **)(*local_48 + 8))();
      }
      local_48 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Units, compareScalingFactorWithNullptrAsBothParameters)
{
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(nullptr, nullptr));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(nullptr, nullptr, false));
}